

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.cpp
# Opt level: O1

TypeMap * __thiscall
wasm::GlobalTypeRewriter::rebuildTypes
          (TypeMap *__return_storage_ptr__,GlobalTypeRewriter *this,
          vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *additionalPrivateTypes)

{
  __node_base_ptr __k;
  TypeBuilder *this_00;
  bool *os;
  int *piVar1;
  iterator __position;
  TypeMap *pTVar2;
  pointer pFVar3;
  pointer pHVar4;
  _Storage<wasm::HeapType,_true> _Var5;
  pointer puVar6;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *p_Var7;
  pair<const_wasm::HeapType,_unsigned_int> pVar8;
  pointer pSVar9;
  bool open;
  int iVar10;
  Shareability share;
  HeapTypeKind HVar11;
  const_iterator __begin2;
  const_iterator cVar12;
  undefined4 extraout_var;
  iterator iVar13;
  HeapType *__args;
  iterator iVar14;
  undefined1 auVar15 [8];
  ulong uVar16;
  undefined4 extraout_var_00;
  _Storage<wasm::HeapType,_true> _Var17;
  size_t sVar18;
  iterator iVar19;
  _Storage<wasm::HeapType,_true> _Var20;
  Type TVar21;
  Struct *pSVar22;
  Type TVar23;
  HeapType HVar24;
  undefined4 extraout_var_01;
  variant_alternative_t<0UL,_variant<vector<HeapType,_allocator<HeapType>_>,_Error>_> *pvVar25;
  mapped_type *pmVar26;
  __node_base_ptr *pp_Var27;
  fd_set *__writefds;
  _Storage<wasm::HeapType,_true> _Var28;
  pointer ppVar29;
  byte extraout_DL;
  fd_set *extraout_RDX;
  fd_set *extraout_RDX_00;
  fd_set *extraout_RDX_01;
  fd_set *__readfds;
  __buckets_ptr *__args_00;
  ulong extraout_RDX_02;
  pointer pvVar30;
  pointer *__k_00;
  TypeMap *__n;
  fd_set *__exceptfds;
  timeval *__timeout;
  uint uVar31;
  long lVar32;
  _Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
  *this_01;
  ulong uVar33;
  iterator __end1;
  _Hash_node_base *p_Var34;
  long lVar35;
  _Storage<wasm::HeapType,_true> _Var36;
  long lVar37;
  pointer pFVar38;
  pointer pHVar39;
  pair<std::__detail::_Node_iterator<std::pair<const_wasm::HeapType,_unsigned_int>,_false,_true>,_bool>
  pVar40;
  pair<std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_bool> pVar41;
  optional<wasm::HeapType> oVar42;
  Signature SVar43;
  optional<wasm::HeapType> desc;
  optional<wasm::HeapType> desc_00;
  optional<wasm::HeapType> super_00;
  optional<wasm::HeapType> super_01;
  undefined1 local_348 [8];
  unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
  additionalSet;
  InsertOrderedMap<wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo> typeInfo;
  undefined1 auStack_2b8 [8];
  optional<wasm::HeapType> super;
  undefined1 local_2a0 [16];
  pointer local_290;
  pointer local_288;
  pointer local_280;
  pointer puStack_278;
  pointer local_270;
  vector<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
  *local_268;
  GlobalTypeRewriter *local_260;
  vector<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
  local_258 [12];
  undefined1 auStack_128 [8];
  vector<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
  privateSupertypes;
  undefined1 auStack_108 [8];
  BuildResult buildResults;
  __node_base_ptr ap_Stack_d8 [2];
  _Storage<wasm::HeapType,_true> local_c8;
  _Storage<wasm::HeapType,_true> local_c0;
  long local_b8;
  pointer local_b0;
  _Storage<wasm::HeapType,_true> _Stack_a8;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> order;
  TypeMap *oldToNewTypes;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> elements;
  undefined1 auStack_58 [8];
  Graph indexGraph;
  iterator __end1_1;
  
  order.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)__return_storage_ptr__;
  wasm::ModuleUtils::collectHeapTypeInfo
            ((InsertOrderedMap<wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo> *)
             &additionalSet._M_h._M_single_bucket,this->wasm,UsedIRTypes,FindVisibility);
  __exceptfds = (fd_set *)auStack_2b8;
  __timeout = (timeval *)auStack_108;
  std::
  _Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _Hashtable<__gnu_cxx::__normal_iterator<wasm::HeapType_const*,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>
            ((_Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)local_348,
             (additionalPrivateTypes->
             super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (additionalPrivateTypes->
             super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
             super__Vector_impl_data._M_finish,0,__exceptfds,__timeout,&oldToNewTypes);
  auStack_128 = (undefined1  [8])0x0;
  privateSupertypes.
  super__Vector_base<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  privateSupertypes.
  super__Vector_base<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
  ::reserve((vector<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
             *)auStack_128,(size_type)typeInfo.Map._M_h._M_before_begin._M_nxt);
  if (typeInfo.Map._M_h._M_single_bucket != (__node_base_ptr)&typeInfo.Map._M_h._M_single_bucket) {
    p_Var34 = typeInfo.Map._M_h._M_single_bucket;
    do {
      __k = p_Var34 + 2;
      if ((*(int *)((long)&p_Var34[3]._M_nxt + 4) == 2) ||
         (cVar12 = std::
                   _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   ::find((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                           *)local_348,(key_type *)__k),
         cVar12.super__Node_iterator_base<wasm::HeapType,_true>._M_cur != (__node_type *)0x0)) {
        auStack_108 = (undefined1  [8])0x0;
        buildResults.
        super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .
        super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
        _0_8_ = 0x10;
        buildResults.
        super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .
        super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_index
             = '\0';
        buildResults.
        super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .
        super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._25_7_ =
             0;
        buildResults.
        super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .
        super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
        _8_8_ = 0;
        buildResults.
        super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .
        super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
        _16_8_ = 0;
        super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._M_payload =
             (_Storage<wasm::HeapType,_true>)0x0;
        auStack_2b8 = (undefined1  [8])__k->_M_nxt;
        super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._M_engaged = true;
        super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._9_7_ = 0;
        std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
                  ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_2a0,
                   (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                   (buildResults.
                    super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                    .
                    super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                    .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    .super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    .super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                    super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                    super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    ._M_u._M_first._M_storage._M_storage + 8));
        std::
        vector<std::pair<wasm::HeapType,wasm::SmallVector<wasm::HeapType,1ul>>,std::allocator<std::pair<wasm::HeapType,wasm::SmallVector<wasm::HeapType,1ul>>>>
        ::emplace_back<std::pair<wasm::HeapType,wasm::SmallVector<wasm::HeapType,1ul>>>
                  ((vector<std::pair<wasm::HeapType,wasm::SmallVector<wasm::HeapType,1ul>>,std::allocator<std::pair<wasm::HeapType,wasm::SmallVector<wasm::HeapType,1ul>>>>
                    *)auStack_128,
                   (pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_> *)auStack_2b8);
        if ((pointer)local_2a0._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_2a0._0_8_,(long)local_290 - local_2a0._0_8_);
        }
        if (buildResults.
            super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
            .
            super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
            .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
            super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
            super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
            super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
            super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u
            ._8_8_ != 0) {
          operator_delete((void *)buildResults.
                                  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                  .
                                  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                  .
                                  super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                  .
                                  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                  .
                                  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                  .
                                  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                  .
                                  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                  ._M_u._8_8_,
                          buildResults.
                          super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                          .
                          super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                          .
                          super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                          .
                          super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                          .
                          super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                          .
                          super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                          .
                          super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                          ._24_8_ - buildResults.
                                    super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                    .
                                    super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                    .
                                    super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                    .
                                    super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                    .
                                    super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                    .
                                    super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                    .
                                    super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                    ._M_u._8_8_);
        }
        iVar10 = (*this->_vptr_GlobalTypeRewriter[7])(this,__k->_M_nxt);
        pVar8 = _auStack_2b8;
        auStack_2b8._4_4_ = extraout_var;
        auStack_2b8._0_4_ = iVar10;
        super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._1_7_ = pVar8._9_7_;
        super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._M_payload._0_1_ = extraout_DL;
        if ((extraout_DL & 1) != 0) {
          iVar13 = std::
                   _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)&additionalSet._M_h._M_single_bucket,(key_type *)auStack_2b8);
          pp_Var27 = &typeInfo.Map._M_h._M_single_bucket;
          if (iVar13.
              super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>,_true>
              ._M_cur != (__node_type *)0x0) {
            pp_Var27 = *(__node_base_ptr **)
                        ((long)iVar13.
                               super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>,_true>
                               ._M_cur + 0x10);
          }
          if (((pp_Var27 != &typeInfo.Map._M_h._M_single_bucket) &&
              (*(int *)((long)pp_Var27 + 0x1c) == 2)) ||
             (cVar12 = std::
                       _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       ::find((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                               *)local_348,(key_type *)auStack_2b8),
             cVar12.super__Node_iterator_base<wasm::HeapType,_true>._M_cur != (__node_type *)0x0)) {
            SmallVector<wasm::HeapType,_1UL>::push_back
                      (&privateSupertypes.
                        super__Vector_base<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[-1].second,(HeapType *)auStack_2b8
                      );
          }
        }
      }
      p_Var34 = p_Var34->_M_nxt;
    } while (p_Var34 != (_Hash_node_base *)&typeInfo.Map._M_h._M_single_bucket);
  }
  ppVar29 = privateSupertypes.
            super__Vector_base<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->wasm->typeIndices)._M_h._M_element_count == 0) {
    TopologicalSort::
    sortOfImpl<__gnu_cxx::__normal_iterator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_*,_std::vector<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_(&)(const_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_&),_wasm::TopologicalSort::sort>
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_2b8,
               (__normal_iterator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_*,_std::vector<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>_>
                )auStack_128,
               (__normal_iterator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_*,_std::vector<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>_>
                )privateSupertypes.
                 super__Vector_base<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
    local_b0 = (pointer)super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                        super__Optional_payload_base<wasm::HeapType>._8_8_;
    _Var36 = (_Storage<wasm::HeapType,_true>)auStack_2b8;
    _Var20 = super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::HeapType>._M_payload;
  }
  else {
    auStack_108 = (undefined1  [8])ap_Stack_d8;
    buildResults.
    super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .
    super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._0_8_ =
         1;
    buildResults.
    super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .
    super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._8_8_ =
         0;
    buildResults.
    super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .
    super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._16_8_
         = 0;
    buildResults.
    super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .
    super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_4_ =
         0x3f800000;
    ap_Stack_d8[0] = (__node_base_ptr)0x0;
    oldToNewTypes = (TypeMap *)0x0;
    elements.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    elements.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    indexGraph.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)auStack_128;
    if (auStack_128 !=
        (undefined1  [8])
        privateSupertypes.
        super__Vector_base<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      auVar15 = auStack_128;
      do {
        super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._M_payload._0_4_ =
             (int)((ulong)((long)elements.
                                 super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                 ._M_impl.super__Vector_impl_data._M_start - (long)oldToNewTypes) >>
                  3);
        auStack_2b8 = (undefined1  [8])
                      (((pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_> *)auVar15)->
                      first).id;
        pVar40 = std::
                 _Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,unsigned_int>,std::allocator<std::pair<wasm::HeapType_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                 ::_M_emplace<std::pair<wasm::HeapType_const,unsigned_int>>
                           ((_Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,unsigned_int>,std::allocator<std::pair<wasm::HeapType_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                             *)auStack_108,auStack_2b8);
        if (((undefined1  [16])pVar40 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          __assert_fail("inserted.second && \"unexpected repeat element\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/topological_sort.h"
                        ,0x3e,
                        "decltype(auto) wasm::TopologicalSort::sortOfImpl(It, It, Args...) [It = __gnu_cxx::__normal_iterator<std::pair<wasm::HeapType, wasm::SmallVector<wasm::HeapType, 1>> *, std::vector<std::pair<wasm::HeapType, wasm::SmallVector<wasm::HeapType, 1>>>>, SortT = std::vector<unsigned int> (&)(const std::vector<std::vector<unsigned int>> &, (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:82:34)), Sort = wasm::TopologicalSort::minSort, Args = <(lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:82:34)>]"
                       );
        }
        __args = (HeapType *)
                 ((long)pVar40.first.
                        super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                        ._M_cur.
                        super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                 + 8);
        if (elements.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
            super__Vector_impl_data._M_start ==
            elements.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
          _M_realloc_insert<wasm::HeapType_const&>
                    ((vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)&oldToNewTypes,
                     (iterator)
                     elements.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                     _M_impl.super__Vector_impl_data._M_start,__args);
        }
        else {
          (elements.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
           super__Vector_impl_data._M_start)->id = __args->id;
          elements.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_start =
               elements.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
        auVar15 = (undefined1  [8])((long)auVar15 + 0x30);
      } while (auVar15 != (undefined1  [8])ppVar29);
    }
    auStack_58 = (undefined1  [8])0x0;
    indexGraph.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    indexGraph.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::reserve((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)auStack_58,
              (long)elements.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                    _M_impl.super__Vector_impl_data._M_start - (long)oldToNewTypes >> 3);
    if ((pointer)indexGraph.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage != ppVar29) {
      privateSupertypes.
      super__Vector_base<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = ppVar29;
      do {
        if (indexGraph.
            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            indexGraph.
            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ::_M_realloc_insert<>
                    ((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      *)auStack_58,
                     (iterator)
                     indexGraph.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
        }
        else {
          ((indexGraph.
            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          ((indexGraph.
            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          ((indexGraph.
            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          indexGraph.
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               indexGraph.
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1;
        }
        lVar37 = ((long)indexGraph.
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage[1].
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)indexGraph.
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage[1].
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) +
                 (long)((indexGraph.
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
        if (lVar37 != 0) {
          p_Var7 = &(indexGraph.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>;
          lVar32 = -8;
          lVar35 = 0;
          do {
            pvVar30 = indexGraph.
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            __k_00 = (pointer *)
                     ((long)indexGraph.
                            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage[1].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar32);
            if (lVar35 == 0) {
              __k_00 = &(p_Var7->_M_impl).super__Vector_impl_data._M_end_of_storage;
            }
            iVar14 = std::
                     _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)auStack_108,(key_type *)__k_00);
            if (iVar14.
                super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>.
                _M_cur == (__node_type *)0x0) {
              std::__throw_out_of_range("_Map_base::at");
            }
            __position._M_current =
                 pvVar30[-1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                 .super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                pvVar30[-1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)(pvVar30 + -1),
                         __position,
                         (uint *)((long)iVar14.
                                        super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                                        ._M_cur + 0x10));
            }
            else {
              *__position._M_current =
                   *(uint *)((long)iVar14.
                                   super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                                   ._M_cur + 0x10);
              pvVar30[-1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
            lVar35 = lVar35 + 1;
            lVar32 = lVar32 + 8;
          } while (lVar37 != lVar35);
        }
        indexGraph.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             indexGraph.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage + 2;
      } while ((pointer)indexGraph.
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage !=
               privateSupertypes.
               super__Vector_base<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    _Stack_a8 = (_Storage<wasm::HeapType,_true>)0x0;
    order.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    order.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::reserve
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&_Stack_a8._M_value,
               (long)elements.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                     _M_impl.super__Vector_impl_data._M_start - (long)oldToNewTypes >> 3);
    auStack_2b8 = (undefined1  [8])auStack_58;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&super,
               ((long)indexGraph.
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start - (long)auStack_58 >> 3) *
               -0x5555555555555555,
               (allocator_type *)
               &elements.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_2a0 + 8),
               ((long)indexGraph.
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start - (long)auStack_58 >> 3) *
               -0x5555555555555555,
               (allocator_type *)
               &elements.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage);
    local_280 = (pointer)0x0;
    puStack_278 = (pointer)0x0;
    local_270 = (pointer)0x0;
    local_268 = (vector<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
                 *)auStack_128;
    local_258[0].
    super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_258[0].
    super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_258[0].
    super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_260 = this;
    if ((long)indexGraph.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start - (long)auStack_58 != 0) {
      lVar37 = (long)indexGraph.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start - (long)auStack_58 >> 3;
      this_01 = (_Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
                 *)(lVar37 * -0x5555555555555555);
      auVar15 = auStack_58;
      do {
        pTVar2 = (TypeMap *)((anon_class_16_2_633b9489 *)auVar15)->map;
        for (__n = (TypeMap *)
                   (((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                    &((anon_class_16_2_633b9489 *)auVar15)->this)->_M_impl).super__Vector_impl_data.
                   _M_start; __n != pTVar2; __n = (TypeMap *)((long)&(__n->_M_h)._M_buckets + 4)) {
          __exceptfds = (fd_set *)(ulong)*(uint *)&(__n->_M_h)._M_buckets;
          piVar1 = (int *)((long)super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                                 super__Optional_payload_base<wasm::HeapType>._M_payload +
                          (long)__exceptfds * 4);
          *piVar1 = *piVar1 + 1;
        }
        auVar15 = (undefined1  [8])&((anon_class_16_2_633b9489 *)((long)auVar15 + 0x10))->map;
      } while (auVar15 !=
               (undefined1  [8])
               indexGraph.
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
      if ((_Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
           *)0xaaaaaaaaaaaaaaa < this_01) {
        std::__throw_length_error("vector::reserve");
      }
      if (this_01 !=
          (_Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
           *)0x0) {
        indexGraph.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)std::
                      _Vector_base<wasm::TopologicalOrdersImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:82:34)>::Selector>_>
                      ::_M_allocate(this_01,(size_t)__n);
        pSVar9 = local_258[0].
                 super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (0 < (long)local_258[0].
                      super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_258[0].
                      super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
                      ._M_impl.super__Vector_impl_data._M_start) {
          memmove(indexGraph.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                  local_258[0].
                  super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
                  ._M_impl.super__Vector_impl_data._M_start,
                  (long)local_258[0].
                        super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_258[0].
                        super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
                        ._M_impl.super__Vector_impl_data._M_start);
        }
        if (pSVar9 != (pointer)0x0) {
          operator_delete(pSVar9,(long)local_258[0].
                                       super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)pSVar9);
        }
        local_258[0].
        super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)indexGraph.
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_258[0].
        super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)((long)&((indexGraph.
                                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_start + lVar37 * 4);
      }
      elements.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_258[0].
      super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_258[0].
           super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      std::
      vector<wasm::TopologicalOrdersImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:82:34)>::Selector>_>
      ::push_back(local_258,
                  (value_type *)
                  &elements.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage);
      pSVar9 = local_258[0].
               super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      __readfds = extraout_RDX;
      if ((undefined1  [8])
          indexGraph.
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != auStack_58) {
        uVar33 = 0;
        do {
          if (*(int *)((long)super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                             super__Optional_payload_base<wasm::HeapType>._M_payload + uVar33 * 4)
              == 0) {
            TopologicalOrdersImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:82:34)>
            ::pushChoice((TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>
                          *)auStack_2b8,(Index)uVar33);
            pSVar9[-1].count = pSVar9[-1].count + 1;
            __readfds = extraout_RDX_00;
          }
          uVar33 = (ulong)((Index)uVar33 + 1);
          uVar16 = ((long)indexGraph.
                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start - (long)auStack_58 >> 3) *
                   -0x5555555555555555;
        } while (uVar33 <= uVar16 && uVar16 - uVar33 != 0);
      }
      __writefds = (fd_set *)
                   (((long)indexGraph.
                           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start - (long)auStack_58 >> 3) *
                   -0x5555555555555555);
      if ((fd_set *)
          (((long)local_258[0].
                  super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_258[0].
                  super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555) <
          __writefds) {
        do {
          iVar10 = TopologicalOrdersImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:82:34)>
                   ::Selector::select(local_258[0].
                                      super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
                                      ._M_impl.super__Vector_impl_data._M_finish + -1,
                                      (int)auStack_2b8,__readfds,__writefds,__exceptfds,__timeout);
          elements.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(extraout_var_00,iVar10);
          std::
          vector<wasm::TopologicalOrdersImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:82:34)>::Selector>_>
          ::push_back(local_258,
                      (value_type *)
                      &elements.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
          __writefds = (fd_set *)
                       (((long)indexGraph.
                               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start - (long)auStack_58 >> 3) *
                       -0x5555555555555555);
          __readfds = extraout_RDX_01;
        } while ((fd_set *)
                 (((long)local_258[0].
                         super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_258[0].
                         super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555) <
                 __writefds);
      }
      TopologicalOrdersImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:82:34)>
      ::Selector::select(local_258[0].
                         super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
                         ._M_impl.super__Vector_impl_data._M_finish + -1,(int)auStack_2b8,__readfds,
                         __writefds,__exceptfds,__timeout);
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_c8._M_value,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_2a0 + 8));
    if (local_258[0].
        super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_258[0].
                      super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_258[0].
                            super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_258[0].
                            super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_280 != (pointer)0x0) {
      operator_delete(local_280,(long)local_270 - (long)local_280);
    }
    if ((pointer)local_2a0._8_8_ != (pointer)0x0) {
      operator_delete((void *)local_2a0._8_8_,(long)local_288 - local_2a0._8_8_);
    }
    if (super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._M_payload !=
        (_Storage<wasm::HeapType,_true>)0x0) {
      operator_delete((void *)super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                              super__Optional_payload_base<wasm::HeapType>._M_payload,
                      local_2a0._0_8_ -
                      (long)super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                            super__Optional_payload_base<wasm::HeapType>._M_payload);
    }
    if (local_c8 != local_c0) {
      _Var36 = local_c8;
      do {
        __args_00 = &(oldToNewTypes->_M_h)._M_buckets + *(uint *)_Var36;
        if (order.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
            super__Vector_impl_data._M_start ==
            order.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::
          _M_realloc_insert<wasm::HeapType>
                    ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&_Stack_a8._M_value,
                     (iterator)
                     order.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                     _M_impl.super__Vector_impl_data._M_start,(HeapType *)__args_00);
        }
        else {
          (order.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
           super__Vector_impl_data._M_start)->id = (uintptr_t)*__args_00;
          order.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_start =
               order.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
        _Var36 = (_Storage<wasm::HeapType,_true>)((long)_Var36 + 4);
      } while (_Var36 != local_c0);
    }
    if (local_c8 != (_Storage<wasm::HeapType,_true>)0x0) {
      operator_delete((void *)local_c8,local_b8 - (long)local_c8);
    }
    _Var20 = (_Storage<wasm::HeapType,_true>)
             order.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
             super__Vector_impl_data._M_start;
    _Var36 = _Stack_a8;
    local_b0 = order.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
               super__Vector_impl_data._M_finish;
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)auStack_58);
    if (oldToNewTypes != (TypeMap *)0x0) {
      operator_delete(oldToNewTypes,
                      (long)elements.
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)oldToNewTypes);
    }
    std::
    _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)auStack_108);
  }
  _Var17 = (_Storage<wasm::HeapType,_true>)((long)_Var20 - 8);
  _Var5 = _Var36;
  if ((ulong)_Var36 < (ulong)_Var17 && _Var36 != _Var20) {
    do {
      _Var28 = (_Storage<wasm::HeapType,_true>)((long)_Var5 + 8);
      uVar33 = *(ulong *)_Var5;
      *(ulong *)_Var5 = *(ulong *)_Var17;
      *(ulong *)_Var17 = uVar33;
      _Var17 = (_Storage<wasm::HeapType,_true>)((long)_Var17 - 8);
      _Var5 = _Var28;
    } while ((ulong)_Var28 < (ulong)_Var17);
  }
  if (_Var36 != _Var20) {
    iVar10 = 0;
    _Var17 = _Var36;
    do {
      super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload._0_4_ = 0;
      auStack_2b8 = (undefined1  [8])*(ulong *)_Var17;
      pVar41 = InsertOrderedMap<wasm::HeapType,_unsigned_int>::insert
                         (&this->typeIndices,(pair<const_wasm::HeapType,_unsigned_int> *)auStack_2b8
                         );
      *(int *)&pVar41.first._M_node._M_node[1]._M_prev = iVar10;
      iVar10 = iVar10 + 1;
      _Var17 = (_Storage<wasm::HeapType,_true>)((long)_Var17 + 8);
    } while (_Var17 != _Var20);
  }
  sVar18 = (this->typeIndices).Map._M_h._M_element_count;
  if (sVar18 == 0) {
    (order.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
     super__Vector_impl_data._M_end_of_storage)->id = 0;
    order.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage[1].id = 0;
    order.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage[4].id = 0;
    order.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage[5].id = 0;
    order.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage[2].id = 0;
    order.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage[3].id = 0;
    order.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage[6].id = 0;
    (order.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
     super__Vector_impl_data._M_end_of_storage)->id =
         (uintptr_t)
         (order.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage + 6);
    order.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage[1].id = 1;
    *(undefined4 *)
     &order.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage[4].id = 0x3f800000;
    order.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage[5].id = 0;
    order.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage[6].id = 0;
  }
  else {
    this_00 = &this->typeBuilder;
    TypeBuilder::grow(this_00,sVar18);
    sVar18 = TypeBuilder::size(this_00);
    TypeBuilder::createRecGroup(this_00,0,sVar18);
    indexGraph.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&(this->typeIndices).List;
    ppVar29 = (pointer)(this->typeIndices).List.
                       super__List_base<std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                       ._M_impl._M_node.super__List_node_base._M_next;
    if (ppVar29 !=
        (pointer)indexGraph.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      typeInfo.List.
      super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
      ._M_impl._M_node._M_size = (size_t)&this->typeIndices;
      uVar31 = 0;
      do {
        local_c8 = (_Storage<wasm::HeapType,_true>)(ppVar29->second).fixed._M_elems[0].id;
        order.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
        super__Vector_impl_data._M_start =
             (ppVar29->second).flexible.
             super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
             super__Vector_impl_data._M_start;
        privateSupertypes.
        super__Vector_base<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = ppVar29;
        _Stack_a8 = local_c8;
        elements.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)this;
        if ((ulong)local_c8 < 0x7d) {
          __assert_fail("!type.isBasic()",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                        ,0x2df,
                        "void wasm::TypeBuilder::copyHeapType(size_t, HeapType, F) [F = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:126:14)]"
                       );
        }
        oVar42 = HeapType::getDeclaredSuperType(&local_c8._M_value);
        pHVar4 = elements.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
        uVar33 = (ulong)uVar31;
        if (((undefined1  [16])
             oVar42.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) !=
            (undefined1  [16])0x0) {
          auStack_2b8 = (undefined1  [8])
                        oVar42.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                        super__Optional_payload_base<wasm::HeapType>._M_payload;
          iVar19 = std::
                   _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)(elements.
                              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + 3),
                          (key_type *)auStack_2b8);
          if (iVar19.
              super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>,_true>
              ._M_cur == (__node_type *)0x0) {
            pHVar39 = pHVar4 + 10;
          }
          else {
            pHVar39 = *(pointer *)
                       ((long)iVar19.
                              super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>,_true>
                              ._M_cur + 0x10);
          }
          if (pHVar39 == pHVar4 + 10) {
            _Var20 = (_Storage<wasm::HeapType,_true>)auStack_2b8;
          }
          else {
            _Var20._M_value =
                 TypeBuilder::getTempHeapType
                           ((TypeBuilder *)(pHVar4 + 2),(ulong)(uint)pHVar39[3].id);
          }
          oVar42.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType>._8_8_ = 1;
          oVar42.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id =
               (HeapType)(HeapType)_Var20;
          TypeBuilder::setSubType(this_00,uVar33,oVar42);
        }
        oVar42 = HeapType::getDescriptorType(&local_c8._M_value);
        pHVar4 = elements.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
        if (((undefined1  [16])
             oVar42.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) !=
            (undefined1  [16])0x0) {
          auStack_2b8 = (undefined1  [8])
                        oVar42.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                        super__Optional_payload_base<wasm::HeapType>._M_payload;
          iVar19 = std::
                   _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)(elements.
                              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + 3),
                          (key_type *)auStack_2b8);
          if (iVar19.
              super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>,_true>
              ._M_cur == (__node_type *)0x0) {
            pHVar39 = pHVar4 + 10;
          }
          else {
            pHVar39 = *(pointer *)
                       ((long)iVar19.
                              super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>,_true>
                              ._M_cur + 0x10);
          }
          if (pHVar39 == pHVar4 + 10) {
            _Var20 = (_Storage<wasm::HeapType,_true>)auStack_2b8;
          }
          else {
            _Var20._M_value =
                 TypeBuilder::getTempHeapType
                           ((TypeBuilder *)(pHVar4 + 2),(ulong)(uint)pHVar39[3].id);
          }
          desc.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType>._8_8_ = 1;
          desc.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id =
               (HeapType)(HeapType)_Var20;
          TypeBuilder::setDescriptor(this_00,uVar33,desc);
        }
        oVar42 = HeapType::getDescribedType(&local_c8._M_value);
        pHVar4 = elements.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
        if (((undefined1  [16])
             oVar42.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) !=
            (undefined1  [16])0x0) {
          auStack_2b8 = (undefined1  [8])
                        oVar42.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                        super__Optional_payload_base<wasm::HeapType>._M_payload;
          iVar19 = std::
                   _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)(elements.
                              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + 3),
                          (key_type *)auStack_2b8);
          if (iVar19.
              super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>,_true>
              ._M_cur == (__node_type *)0x0) {
            pHVar39 = pHVar4 + 10;
          }
          else {
            pHVar39 = *(pointer *)
                       ((long)iVar19.
                              super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>,_true>
                              ._M_cur + 0x10);
          }
          if (pHVar39 == pHVar4 + 10) {
            _Var20 = (_Storage<wasm::HeapType,_true>)auStack_2b8;
          }
          else {
            _Var20._M_value =
                 TypeBuilder::getTempHeapType
                           ((TypeBuilder *)(pHVar4 + 2),(ulong)(uint)pHVar39[3].id);
          }
          desc_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType>._8_8_ = 1;
          desc_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id =
               (HeapType)(HeapType)_Var20;
          TypeBuilder::setDescribed(this_00,uVar33,desc_00);
        }
        open = HeapType::isOpen(&local_c8._M_value);
        TypeBuilder::setOpen(this_00,uVar33,open);
        share = HeapType::getShared(&local_c8._M_value);
        TypeBuilder::setShared(this_00,uVar33,share);
        elements.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&elements.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
        auStack_58 = (undefined1  [8])&oldToNewTypes;
        oldToNewTypes = (TypeMap *)this_00;
        indexGraph.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)this_00;
        HVar11 = HeapType::getKind(&local_c8._M_value);
        switch(HVar11) {
        case Basic:
          handle_unreachable("unexpected kind",
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                             ,0x31b);
        case Func:
          SVar43 = HeapType::getSignature(&local_c8._M_value);
          TVar23 = TypeBuilder::
                   copyHeapType<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:126:14)>
                   ::anon_class_16_2_ecc023e0::operator()
                             ((anon_class_16_2_ecc023e0 *)auStack_58,SVar43.params.id);
          TVar21 = TypeBuilder::
                   copyHeapType<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:126:14)>
                   ::anon_class_16_2_ecc023e0::operator()
                             ((anon_class_16_2_ecc023e0 *)auStack_58,SVar43.results.id);
          SVar43.results.id = TVar21.id;
          SVar43.params.id = TVar23.id;
          TypeBuilder::setHeapType(this_00,uVar33,SVar43);
          break;
        case Struct:
          pSVar22 = HeapType::getStruct(&local_c8._M_value);
          _auStack_2b8 = (pair<const_wasm::HeapType,_unsigned_int>)ZEXT816(0);
          super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType>._M_engaged = false;
          super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType>._9_7_ = 0;
          std::vector<wasm::Field,_std::allocator<wasm::Field>_>::reserve
                    ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_2b8,
                     (long)(pSVar22->fields).
                           super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(pSVar22->fields).
                           super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                           super__Vector_impl_data._M_start >> 4);
          pFVar3 = (pSVar22->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          for (pFVar38 = (pSVar22->fields).
                         super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                         super__Vector_impl_data._M_start; pFVar38 != pFVar3; pFVar38 = pFVar38 + 1)
          {
            auStack_108 = (undefined1  [8])(pFVar38->type).id;
            buildResults.
            super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
            .
            super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
            .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
            super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
            super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
            super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
            super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u
            ._0_4_ = pFVar38->packedType;
            buildResults.
            super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
            .
            super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
            .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
            super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
            super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
            super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
            super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u
            ._4_4_ = pFVar38->mutable_;
            auStack_108 = (undefined1  [8])
                          TypeBuilder::
                          copyHeapType<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:126:14)>
                          ::anon_class_16_2_ecc023e0::operator()
                                    ((anon_class_16_2_ecc023e0 *)auStack_58,(Type)auStack_108);
            if (super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::HeapType>._M_payload ==
                (_Storage<wasm::HeapType,_true>)
                super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::HeapType>._8_8_) {
              std::vector<wasm::Field,std::allocator<wasm::Field>>::
              _M_realloc_insert<wasm::Field_const&>
                        ((vector<wasm::Field,std::allocator<wasm::Field>> *)auStack_2b8,
                         (iterator)
                         super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                         super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id,
                         (Field *)auStack_108);
            }
            else {
              *(undefined1 (*) [8])
               super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::HeapType>._M_payload = auStack_108;
              *(undefined8 *)
               ((long)super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                      super__Optional_payload_base<wasm::HeapType>._M_payload + 8) =
                   buildResults.
                   super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                   .
                   super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                   .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                   super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                   super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                   super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                   super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                   ._M_u._0_8_;
              super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::HeapType>._M_payload =
                   (_Storage<wasm::HeapType,_true>)
                   ((long)super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                          super__Optional_payload_base<wasm::HeapType>._M_payload + 0x10);
            }
          }
          std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
                    ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_108,
                     (vector<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_2b8);
          TypeBuilder::setHeapType(this_00,uVar33,(Struct *)auStack_108);
          if (auStack_108 != (undefined1  [8])0x0) {
            operator_delete((void *)auStack_108,
                            buildResults.
                            super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                            .
                            super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                            .
                            super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                            .
                            super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                            .
                            super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                            .
                            super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                            .
                            super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                            ._M_u._8_8_ - (long)auStack_108);
          }
          if (auStack_2b8 != (undefined1  [8])0x0) {
            operator_delete((void *)auStack_2b8,
                            super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                            super__Optional_payload_base<wasm::HeapType>._8_8_ - (long)auStack_2b8);
          }
          break;
        case Array:
          HeapType::getArray((HeapType *)auStack_2b8);
          _Var20 = super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                   super__Optional_payload_base<wasm::HeapType>._M_payload;
          auStack_2b8 = (undefined1  [8])
                        TypeBuilder::
                        copyHeapType<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:126:14)>
                        ::anon_class_16_2_ecc023e0::operator()
                                  ((anon_class_16_2_ecc023e0 *)auStack_58,(Type)auStack_2b8);
          super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType>._M_payload = _Var20;
          TypeBuilder::setHeapType(this_00,uVar33,(Array *)auStack_2b8);
          break;
        case Cont:
          TVar23.id = (uintptr_t)HeapType::getContinuation(&local_c8._M_value);
          pHVar4 = elements.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
          auStack_2b8 = (undefined1  [8])TVar23.id;
          iVar19 = std::
                   _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)(elements.
                              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + 3),
                          (key_type *)auStack_2b8);
          if (iVar19.
              super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>,_true>
              ._M_cur == (__node_type *)0x0) {
            pHVar39 = pHVar4 + 10;
          }
          else {
            pHVar39 = *(pointer *)
                       ((long)iVar19.
                              super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>,_true>
                              ._M_cur + 0x10);
          }
          if (pHVar39 == pHVar4 + 10) {
            HVar24.id = (uintptr_t)auStack_2b8;
          }
          else {
            HVar24 = TypeBuilder::getTempHeapType
                               ((TypeBuilder *)(pHVar4 + 2),(ulong)(uint)pHVar39[3].id);
          }
          TypeBuilder::setHeapType(this_00,uVar33,(Continuation)HVar24.id);
        }
        HVar11 = HeapType::getKind(&_Stack_a8._M_value);
        switch(HVar11) {
        case Basic:
          handle_unreachable("unexpected kind",
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp"
                             ,0xa0);
        case Func:
          auStack_108 = (undefined1  [8])TypeBuilder::getTempHeapType(this_00,uVar33);
          _auStack_2b8 = (pair<const_wasm::HeapType,_unsigned_int>)
                         HeapType::getSignature((HeapType *)auStack_108);
          (*this->_vptr_GlobalTypeRewriter[5])(this,_Stack_a8,auStack_2b8);
          TypeBuilder::setHeapType(this_00,uVar33,(Signature)_auStack_2b8);
          break;
        case Struct:
          auStack_108 = (undefined1  [8])TypeBuilder::getTempHeapType(this_00,uVar33);
          pSVar22 = HeapType::getStruct((HeapType *)auStack_108);
          std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
                    ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_2b8,
                     &pSVar22->fields);
          (*this->_vptr_GlobalTypeRewriter[2])(this,_Stack_a8,(Struct *)auStack_2b8);
          TypeBuilder::setHeapType(this_00,uVar33,(Struct *)auStack_2b8);
          if (auStack_2b8 != (undefined1  [8])0x0) {
            operator_delete((void *)auStack_2b8,
                            super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                            super__Optional_payload_base<wasm::HeapType>._8_8_ - (long)auStack_2b8);
          }
          break;
        case Array:
          HVar24 = TypeBuilder::getTempHeapType(this_00,uVar33);
          auStack_2b8 = (undefined1  [8])HVar24;
          HeapType::getArray((HeapType *)auStack_108);
          (*this->_vptr_GlobalTypeRewriter[3])(this,_Stack_a8,(HeapType *)auStack_108);
          super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType>._M_payload =
               (_Storage<wasm::HeapType,_true>)
               buildResults.
               super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
               .
               super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
               .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
               super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
               super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
               super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
               super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
               _M_u._0_8_;
          auStack_2b8 = auStack_108;
          TypeBuilder::setHeapType(this_00,uVar33,(Array *)auStack_2b8);
          break;
        case Cont:
          auStack_108 = (undefined1  [8])TypeBuilder::getTempHeapType(this_00,uVar33);
          TVar23.id = (uintptr_t)HeapType::getContinuation((HeapType *)auStack_108);
          auStack_2b8 = (undefined1  [8])TVar23.id;
          (*this->_vptr_GlobalTypeRewriter[4])(this,_Stack_a8,auStack_2b8);
          TypeBuilder::setHeapType(this_00,uVar33,(Continuation)auStack_2b8);
        }
        iVar10 = (*this->_vptr_GlobalTypeRewriter[7])(this,_Stack_a8);
        pVar8 = _auStack_2b8;
        auStack_2b8._4_4_ = extraout_var_01;
        auStack_2b8._0_4_ = iVar10;
        if ((extraout_RDX_02 & 1) == 0) {
          super_01.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType>._8_8_ = 0;
          super_01.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType>._M_payload =
               (_Storage<wasm::HeapType,_true>)extraout_RDX_02;
          _auStack_2b8 = pVar8;
          TypeBuilder::setSubType(this_00,uVar33,super_01);
        }
        else {
          super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType>._M_payload = pVar8._8_8_;
          _Var20._M_value.id =
               (HeapType)
               std::
               _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)typeInfo.List.
                         super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
                         ._M_impl._M_node._M_size,(key_type *)auStack_2b8);
          pvVar30 = indexGraph.
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
          if (_Var20 != (_Storage<wasm::HeapType,_true>)0x0) {
            pvVar30 = *(pointer *)((long)_Var20 + 0x10);
          }
          if (pvVar30 !=
              indexGraph.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            _Var20._M_value =
                 TypeBuilder::getTempHeapType
                           (this_00,(ulong)*(uint *)&pvVar30[1].
                                                                                                          
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (pvVar30 ==
              indexGraph.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            _Var20 = (_Storage<wasm::HeapType,_true>)auStack_2b8;
          }
          super_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType>._8_8_ = 1;
          super_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id =
               (HeapType)(HeapType)_Var20;
          TypeBuilder::setSubType(this_00,uVar33,super_00);
        }
        (*this->_vptr_GlobalTypeRewriter[6])(this,this_00,uVar33,_Stack_a8);
        uVar31 = uVar31 + 1;
        ppVar29 = (pointer)((privateSupertypes.
                             super__Vector_base<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->first).id;
      } while (ppVar29 !=
               (pointer)indexGraph.
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    TypeBuilder::build((BuildResult *)auStack_108,this_00);
    if (buildResults.
        super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .
        super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
        _M_first._M_storage._M_storage[0x10] == '\x01') {
      Fatal::Fatal((Fatal *)auStack_2b8);
      os = &super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::HeapType>._M_engaged;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)os,"Internal GlobalTypeRewriter build error: ",0x29);
      wasm::operator<<((ostream *)os,
                       buildResults.
                       super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                       .
                       super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                       .
                       super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       .
                       super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       .
                       super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       .
                       super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       .
                       super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       ._M_u._0_4_);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)os," at index ",10);
      Fatal::operator<<((Fatal *)auStack_2b8,(unsigned_long *)auStack_108);
      Fatal::~Fatal((Fatal *)auStack_2b8);
    }
    pvVar25 = std::
              get<0ul,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,wasm::TypeBuilder::Error>
                        ((variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                          *)auStack_108);
    (order.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
     super__Vector_impl_data._M_end_of_storage)->id =
         (uintptr_t)
         (order.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage + 6);
    order.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage[1].id = 1;
    order.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage[2].id = 0;
    order.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage[3].id = 0;
    *(undefined4 *)
     &order.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage[4].id = 0x3f800000;
    order.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage[5].id = 0;
    order.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage[6].id = 0;
    pvVar30 = (pointer)((indexGraph.
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                       super__Vector_impl_data._M_start;
    if (pvVar30 !=
        indexGraph.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      do {
        puVar6 = pvVar30[1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        _auStack_2b8 = *(pair<const_wasm::HeapType,_unsigned_int> *)
                        &(pvVar30->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_end_of_storage;
        pHVar4 = (pvVar25->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        pmVar26 = std::__detail::
                  _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)order.
                                  super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (key_type *)auStack_2b8);
        pmVar26->id = pHVar4[(ulong)puVar6 & 0xffffffff].id;
        pvVar30 = (pointer)(pvVar30->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           )._M_impl.super__Vector_impl_data._M_start;
      } while (pvVar30 !=
               indexGraph.
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    mapTypeNamesAndIndices
              (this,(TypeMap *)
                    order.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&>
      ::_S_vtable._M_arr
      [buildResults.
       super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
       .
       super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
       .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
       _16_8_ & 0xff]._M_data)
              ((anon_class_1_0_00000001 *)auStack_2b8,
               (variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                *)auStack_108);
  }
  if (_Var36 != (_Storage<wasm::HeapType,_true>)0x0) {
    operator_delete((void *)_Var36,(long)local_b0 - (long)_Var36);
  }
  std::
  vector<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
  ::~vector((vector<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
             *)auStack_128);
  std::
  _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_348);
  while (typeInfo.Map._M_h._M_single_bucket != (__node_base_ptr)&typeInfo.Map._M_h._M_single_bucket)
  {
    p_Var34 = (typeInfo.Map._M_h._M_single_bucket)->_M_nxt;
    operator_delete(typeInfo.Map._M_h._M_single_bucket,0x20);
    typeInfo.Map._M_h._M_single_bucket = p_Var34;
  }
  std::
  _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&additionalSet._M_h._M_single_bucket);
  return (TypeMap *)
         order.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
}

Assistant:

GlobalTypeRewriter::TypeMap GlobalTypeRewriter::rebuildTypes(
  const std::vector<HeapType>& additionalPrivateTypes) {
  // Find the heap types that are not publicly observable. Even in a closed
  // world scenario, don't modify public types because we assume that they may
  // be reflected on or used for linking. Figure out where each private type
  // will be located in the builder.
  auto typeInfo = ModuleUtils::collectHeapTypeInfo(
    wasm,
    ModuleUtils::TypeInclusion::UsedIRTypes,
    ModuleUtils::VisibilityHandling::FindVisibility);

  std::unordered_set<HeapType> additionalSet(additionalPrivateTypes.begin(),
                                             additionalPrivateTypes.end());

  std::vector<std::pair<HeapType, SmallVector<HeapType, 1>>> privateSupertypes;
  privateSupertypes.reserve(typeInfo.size());
  for (auto& [type, info] : typeInfo) {
    if (info.visibility != ModuleUtils::Visibility::Private &&
        !additionalSet.count(type)) {
      continue;
    }
    privateSupertypes.push_back({type, {}});

    if (auto super = getDeclaredSuperType(type)) {
      auto it = typeInfo.find(*super);
      // Record the supertype only if it is among the private types.
      if ((it != typeInfo.end() &&
           it->second.visibility == ModuleUtils::Visibility::Private) ||
          additionalSet.count(*super)) {
        privateSupertypes.back().second.push_back(*super);
      }
    }
  }

  // Topological sort to have subtypes first. This is the opposite of the
  // order we need, so the comparison is the opposite of what we ultimately
  // want.
  std::vector<HeapType> sorted;
  if (wasm.typeIndices.empty()) {
    sorted = TopologicalSort::sortOf(privateSupertypes.begin(),
                                     privateSupertypes.end());
  } else {
    sorted =
      TopologicalSort::minSortOf(privateSupertypes.begin(),
                                 privateSupertypes.end(),
                                 [&](Index a, Index b) {
                                   auto typeA = privateSupertypes[a].first;
                                   auto typeB = privateSupertypes[b].first;
                                   // Preserve type order.
                                   auto itA = wasm.typeIndices.find(typeA);
                                   auto itB = wasm.typeIndices.find(typeB);
                                   bool hasA = itA != wasm.typeIndices.end();
                                   bool hasB = itB != wasm.typeIndices.end();
                                   if (hasA != hasB) {
                                     // Types with preserved indices must be
                                     // sorted before (after in this reversed
                                     // comparison) types without indices to
                                     // maintain transitivity.
                                     return !hasA;
                                   }
                                   if (hasA && *itA != *itB) {
                                     return !(itA->second < itB->second);
                                   }
                                   // Break ties by the arbitrary order we
                                   // have collected the types in.
                                   return a > b;
                                 });
  }
  std::reverse(sorted.begin(), sorted.end());
  Index i = 0;
  for (auto type : sorted) {
    typeIndices[type] = i++;
  }

  if (typeIndices.size() == 0) {
    return {};
  }

  typeBuilder.grow(typeIndices.size());

  // All the input types are distinct, so we need to make sure the output types
  // are distinct as well. Further, the new types may have more recursions than
  // the original types, so the old recursion groups may not be sufficient any
  // more. Both of these problems are solved by putting all the new types into a
  // single large recursion group.
  typeBuilder.createRecGroup(0, typeBuilder.size());

  // Create the temporary heap types.
  i = 0;
  auto map = [&](HeapType type) -> HeapType {
    if (auto it = typeIndices.find(type); it != typeIndices.end()) {
      return typeBuilder[it->second];
    }
    return type;
  };
  for (auto [type, _] : typeIndices) {
    typeBuilder[i].copy(type, map);
    switch (type.getKind()) {
      case HeapTypeKind::Func: {
        auto newSig = HeapType(typeBuilder[i]).getSignature();
        modifySignature(type, newSig);
        typeBuilder[i] = newSig;
        break;
      }
      case HeapTypeKind::Struct: {
        auto newStruct = HeapType(typeBuilder[i]).getStruct();
        modifyStruct(type, newStruct);
        typeBuilder[i] = newStruct;
        break;
      }
      case HeapTypeKind::Array: {
        auto newArray = HeapType(typeBuilder[i]).getArray();
        modifyArray(type, newArray);
        typeBuilder[i] = newArray;
        break;
      }
      case HeapTypeKind::Cont: {
        auto newCont = HeapType(typeBuilder[i]).getContinuation();
        modifyContinuation(type, newCont);
        typeBuilder[i] = newCont;
        break;
      }
      case HeapTypeKind::Basic:
        WASM_UNREACHABLE("unexpected kind");
    }

    if (auto super = getDeclaredSuperType(type)) {
      typeBuilder[i].subTypeOf(map(*super));
    } else {
      typeBuilder[i].subTypeOf(std::nullopt);
    }

    modifyTypeBuilderEntry(typeBuilder, i, type);
    ++i;
  }

  auto buildResults = typeBuilder.build();
#ifndef NDEBUG
  if (auto* err = buildResults.getError()) {
    Fatal() << "Internal GlobalTypeRewriter build error: " << err->reason
            << " at index " << err->index;
  }
#endif
  auto& newTypes = *buildResults;

  // TODO: It is possible that the newly built rec group matches some public rec
  // group. If that is the case, we need to try a different permutation of the
  // types or add a brand type to distinguish the private types.

  // Map the old types to the new ones.
  TypeMap oldToNewTypes;
  for (auto [type, index] : typeIndices) {
    oldToNewTypes[type] = newTypes[index];
  }
  mapTypeNamesAndIndices(oldToNewTypes);
  return oldToNewTypes;
}